

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

void Amap_ManMatch(Amap_Man_t *p,int fFlow,int fRefs)

{
  Aig_MmFlex_t *p_00;
  Amap_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  Aig_MmFlex_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int level;
  long lVar6;
  float fVar7;
  float fVar8;
  timespec ts;
  timespec local_50;
  double local_40;
  double local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  p_00 = p->pMemCutBest;
  pAVar3 = Aig_MmFlexStart();
  p->pMemCutBest = pAVar3;
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pNode = (Amap_Obj_t *)pVVar4->pArray[lVar6];
      if (((pNode != (Amap_Obj_t *)0x0) &&
          (((undefined1  [96])*pNode & (undefined1  [96])0x6) == (undefined1  [96])0x4 ||
           ((undefined1  [96])*pNode & (undefined1  [96])0x7) == (undefined1  [96])0x6)) &&
         ((pNode->field_11).pData != (void *)0x0)) {
        Amap_ManMatchNode(p,pNode,fFlow,fRefs);
      }
      lVar6 = lVar6 + 1;
      pVVar4 = p->vObjs;
    } while (lVar6 < pVVar4->nSize);
  }
  Aig_MmFlexStop(p_00,0);
  fVar7 = Amap_ManComputeMapping(p);
  uVar2 = Amap_ManCountInverters(p);
  if (p->pPars->fVerbose != 0) {
    fVar8 = (float)(int)uVar2 * p->fAreaInv;
    local_38 = (double)fVar8;
    local_40 = (double)(fVar8 + fVar7);
    fVar8 = Amap_ManMaxDelay(p);
    iVar1 = 0x9c6ad8;
    printf("Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ",local_40,(double)fVar7,
           local_38,(double)fVar8,(ulong)uVar2);
    Abc_Print(iVar1,"%s =","Time ");
    level = 3;
    iVar1 = clock_gettime(3,&local_50);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_ManMatch( Amap_Man_t * p, int fFlow, int fRefs )
{
    Aig_MmFlex_t * pMemOld;
    Amap_Obj_t * pObj;
    float Area;
    int i, nInvs;
    abctime clk = Abc_Clock();
    pMemOld = p->pMemCutBest;
    p->pMemCutBest = Aig_MmFlexStart();
    Amap_ManForEachNode( p, pObj, i )
        if ( pObj->pData )
            Amap_ManMatchNode( p, pObj, fFlow, fRefs );
    Aig_MmFlexStop( pMemOld, 0 );
    Area = Amap_ManComputeMapping( p );
    nInvs = Amap_ManCountInverters( p );
if ( p->pPars->fVerbose )
{
    printf( "Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ", 
        Area + nInvs * p->fAreaInv, 
        Area, nInvs * p->fAreaInv, nInvs,
        Amap_ManMaxDelay(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
}
    // test procedures
//    Amap_ManForEachNode( p, pObj, i )
//        Amap_CutAreaTest( p, pObj );
}